

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O2

void do_bidi_new(BidiContext *ctx,bidi_char *text,size_t textlen)

{
  long *plVar1;
  byte *pbVar2;
  _Bool _Var3;
  BidiType BVar4;
  undefined4 uVar5;
  size_t sVar6;
  bidi_char *pbVar7;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  BidiType BVar26;
  bool bVar27;
  byte bVar28;
  uchar uVar29;
  BidiType BVar30;
  size_t i;
  BidiType *pBVar31;
  uchar *puVar32;
  size_t *psVar33;
  _Bool *p_Var34;
  IsolatingRunSequence *pIVar35;
  size_t sVar36;
  ulong uVar37;
  size_t *psVar38;
  long lVar39;
  long lVar40;
  DirectionalOverride DVar41;
  uint uVar42;
  size_t sVar43;
  ulong uVar44;
  byte bVar45;
  size_t sVar46;
  uint uVar47;
  size_t sVar48;
  size_t sVar49;
  BidiType BVar50;
  size_t sVar51;
  ulong uVar52;
  size_t *psVar53;
  BidiType BVar54;
  size_t sVar55;
  ulong uVar56;
  ulong uVar57;
  size_t c_2;
  uint *puVar58;
  bool bVar59;
  ushort uVar60;
  undefined1 auVar61 [15];
  undefined1 auVar62 [16];
  
  if (ctx->internal_array_sizes < textlen) {
    ctx->internal_array_sizes = textlen;
    pBVar31 = (BidiType *)saferealloc(ctx->types,textlen,4);
    ctx->types = pBVar31;
    pBVar31 = (BidiType *)saferealloc(ctx->origTypes,ctx->internal_array_sizes,4);
    ctx->origTypes = pBVar31;
    puVar32 = (uchar *)saferealloc(ctx->levels,ctx->internal_array_sizes,1);
    ctx->levels = puVar32;
    psVar33 = (size_t *)saferealloc(ctx->irsindices,ctx->internal_array_sizes,8);
    ctx->irsindices = psVar33;
    p_Var34 = (_Bool *)saferealloc(ctx->irsdone,ctx->internal_array_sizes,1);
    ctx->irsdone = p_Var34;
    psVar33 = (size_t *)saferealloc(ctx->bracketpos,ctx->internal_array_sizes,8);
    ctx->bracketpos = psVar33;
  }
  ctx->text = text;
  ctx->textlen = textlen;
  puVar58 = &text->wc;
  for (sVar55 = 0; textlen != sVar55; sVar55 = sVar55 + 1) {
    bVar28 = bidi_getType(*puVar58);
    ctx->origTypes[sVar55] = (uint)bVar28;
    ctx->types[sVar55] = (uint)bVar28;
    puVar58 = puVar58 + 3;
  }
  sVar55 = 0;
  do {
    if (textlen == sVar55) {
      BVar30 = ctx->paragraphOverride;
      if ((0x83f6U >> (BVar30 & (CS|AN)) & 1) == 0) {
        return;
      }
      goto LAB_00101683;
    }
    pBVar31 = ctx->types + sVar55;
    sVar55 = sVar55 + 1;
  } while ((0x83f6U >> (*pBVar31 & (CS|AN)) & 1) == 0);
  BVar30 = ctx->paragraphOverride;
LAB_00101683:
  if (BVar30 == L) {
    uVar29 = '\0';
  }
  else if (BVar30 == R) {
    uVar29 = '\x01';
  }
  else {
    uVar29 = rule_p2_p3(ctx->types,textlen);
  }
  ctx->paragraphLevel = uVar29;
  ctx->ds_sp = 0xffffffffffffffff;
  push(ctx,uVar29,DO_NEUTRAL,false);
  psVar33 = &ctx->overflowIsolateCount;
  psVar53 = &ctx->validIsolateCount;
  ctx->overflowIsolateCount = 0;
  ctx->overflowEmbeddingCount = 0;
  ctx->validIsolateCount = 0;
  for (uVar57 = 0; uVar56 = ctx->textlen, uVar57 < uVar56; uVar57 = uVar57 + 1) {
    pBVar31 = ctx->types;
    BVar30 = pBVar31[uVar57];
    switch(BVar30 - LRE) {
    case L:
    case LRE:
    case AL:
    case RLE:
      ctx->levels[uVar57] = ctx->dsstack[ctx->ds_sp].level;
      switch(BVar30 - LRE) {
      case L:
        bVar28 = (ctx->dsstack[ctx->ds_sp].level | 1) + 1;
        goto LAB_00101900;
      case LRE:
        bVar28 = (ctx->dsstack[ctx->ds_sp].level | 1) + 1;
        DVar41 = DO_LTR;
        break;
      default:
        __assert_fail("false && \"how did this get past the outer switch?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                      ,0xa95,"void process_explicit_embeddings(BidiContext *)");
      case AL:
        bVar28 = ctx->dsstack[ctx->ds_sp].level + 1 | 1;
LAB_00101900:
        DVar41 = DO_NEUTRAL;
        break;
      case RLE:
        bVar28 = ctx->dsstack[ctx->ds_sp].level + 1 | 1;
        DVar41 = DO_RTL;
      }
      if (bVar28 < 0x7e) {
        if (*psVar33 == 0) {
          sVar55 = ctx->overflowEmbeddingCount;
          if (sVar55 != 0) goto LAB_0010195d;
          push(ctx,bVar28,DVar41,false);
        }
      }
      else if (*psVar33 == 0) {
        sVar55 = ctx->overflowEmbeddingCount;
LAB_0010195d:
        ctx->overflowEmbeddingCount = sVar55 + 1;
      }
      break;
    case RLI:
      if (*psVar33 == 0) {
        if (ctx->overflowEmbeddingCount == 0) {
          if ((ctx->ds_sp != 0) && (ctx->dsstack[ctx->ds_sp].isolate == false)) {
            pop(ctx);
          }
        }
        else {
          ctx->overflowEmbeddingCount = ctx->overflowEmbeddingCount - 1;
        }
      }
    case NSM:
      uVar29 = ctx->dsstack[ctx->ds_sp].level;
LAB_00101861:
      ctx->levels[uVar57] = uVar29;
      break;
    case PDF:
      sVar55 = *psVar33;
      psVar38 = psVar33;
      if (sVar55 == 0) {
        if (*psVar53 == 0) goto switchD_00101729_caseD_3;
        ctx->overflowEmbeddingCount = 0;
        do {
          _Var3 = ctx->dsstack[ctx->ds_sp].isolate;
          pop(ctx);
        } while (_Var3 != true);
        sVar55 = *psVar53;
        psVar38 = psVar53;
      }
      *psVar38 = sVar55 - 1;
    default:
switchD_00101729_caseD_3:
      ctx->levels[uVar57] = ctx->dsstack[ctx->ds_sp].level;
      DVar41 = ctx->dsstack[ctx->ds_sp].override;
      if (DVar41 != DO_NEUTRAL) {
        ctx->types[uVar57] = (uint)(DVar41 != DO_LTR) << 2;
      }
      break;
    case PDI:
      sVar55 = find_matching_pdi(pBVar31,uVar57,uVar56);
      uVar29 = rule_p2_p3(pBVar31 + uVar57 + 1,sVar55 - (uVar57 + 1));
      BVar30 = (uint)(uVar29 == '\x01') * 5 + LRI;
    case LRO:
    case RLO:
      ctx->levels[uVar57] = ctx->dsstack[ctx->ds_sp].level;
      sVar55 = ctx->ds_sp;
      DVar41 = ctx->dsstack[sVar55].override;
      if (DVar41 != DO_NEUTRAL) {
        BVar50 = L;
        if ((DVar41 != DO_LTR) && (BVar50 = BVar30, DVar41 == DO_RTL)) {
          BVar50 = R;
        }
        ctx->types[uVar57] = BVar50;
      }
      bVar28 = ctx->dsstack[sVar55].level;
      bVar45 = (bVar28 | 1) + 1;
      if (BVar30 == RLI) {
        bVar45 = bVar28 + 1 | 1;
      }
      if ((ctx->overflowIsolateCount == 0 && bVar45 < 0x7e) && (ctx->overflowEmbeddingCount == 0)) {
        push(ctx,bVar45,DO_NEUTRAL,true);
        ctx->validIsolateCount = ctx->validIsolateCount + 1;
      }
      else {
        *psVar33 = ctx->overflowIsolateCount + 1;
      }
      break;
    case BN:
      if (uVar57 != uVar56 - 1) {
        __assert_fail("i == ctx->textlen - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                      ,0xaf5,"void process_explicit_embeddings(BidiContext *)");
      }
      uVar29 = ctx->paragraphLevel;
      goto LAB_00101861;
    }
  }
  for (uVar57 = 0; uVar57 < uVar56; uVar57 = uVar57 + 1) {
    pBVar31 = ctx->types;
    if ((((0x402c6U >> (pBVar31[uVar57] & (CS|AN)) & 1) != 0) && (pBVar31[uVar57] = BN, uVar57 != 0)
        ) && (pBVar31[uVar57 - 1] == BN)) {
      ctx->levels[uVar57] = ctx->levels[uVar57 - 1];
      uVar56 = ctx->textlen;
    }
  }
  sVar46 = 0;
  memset(ctx->irsdone,0,uVar56);
  uVar57 = ctx->textlen;
  uVar56 = 0;
  sVar55 = 0;
  while (uVar56 < uVar57) {
    if (ctx->irsdone[uVar56] == true) {
      uVar56 = uVar56 + 1;
    }
    else {
      pIVar35 = (IsolatingRunSequence *)
                safegrowarray(ctx->irslist,&ctx->irslistsize,0x20,sVar55,1,false);
      ctx->irslist = pIVar35;
      pIVar35[sVar55].start = sVar46;
      puVar32 = ctx->levels;
      uVar57 = ctx->textlen;
      uVar29 = puVar32[uVar56];
      uVar37 = uVar56;
      while (uVar37 < uVar57) {
        if (puVar32[uVar37] != uVar29) {
          __assert_fail("ctx->levels[j] == irslevel",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                        ,0xb90,"void find_isolating_run_sequences(BidiContext *, irs_fn_t)");
        }
        psVar33 = ctx->irsindices;
        p_Var34 = ctx->irsdone;
        sVar43 = sVar46;
        do {
          sVar36 = uVar37;
          sVar46 = sVar43 + 1;
          p_Var34[sVar36] = true;
          psVar33[sVar43] = sVar36;
          uVar57 = ctx->textlen;
          if (uVar57 <= sVar36 + 1) break;
          uVar37 = sVar36 + 1;
          sVar43 = sVar46;
        } while (puVar32[sVar36 + 1] == uVar29);
        if ((0x908U >> (ctx->types[sVar36] & (CS|AN)) & 1) == 0) break;
        uVar37 = find_matching_pdi(ctx->types,sVar36,uVar57);
      }
      pIVar35[sVar55].end = sVar46;
      bVar28 = ctx->paragraphLevel;
      uVar37 = uVar56;
      do {
        bVar59 = uVar37 == 0;
        uVar37 = uVar37 - 1;
        if (bVar59) {
          pBVar31 = ctx->types;
          bVar45 = bVar28;
          goto LAB_00101b0a;
        }
        pBVar31 = ctx->types;
      } while (pBVar31[uVar37] == BN);
      bVar45 = puVar32[uVar37];
LAB_00101b0a:
      if (bVar45 < puVar32[uVar56]) {
        bVar45 = puVar32[uVar56];
      }
      pIVar35[sVar55].sos = (uint)(byte)((bVar45 & 1) << 2);
      uVar37 = ctx->irsindices[sVar46 - 1];
      pbVar2 = puVar32 + uVar37;
      if ((0x908U >> (pBVar31[uVar37] & (CS|AN)) & 1) == 0) {
        do {
          uVar37 = uVar37 + 1;
          if (uVar57 <= uVar37) goto LAB_00101b61;
        } while (pBVar31[uVar37] == BN);
        bVar28 = puVar32[uVar37];
      }
LAB_00101b61:
      if (bVar28 < *pbVar2) {
        bVar28 = *pbVar2;
      }
      auVar62 = psllw(ZEXT216(CONCAT11(uVar29,bVar28)),2);
      auVar61 = auVar62._0_15_ & DAT_00108950._0_15_;
      auVar11[0xd] = 0;
      auVar11._0_13_ = auVar61._0_13_;
      auVar11[0xe] = auVar61[7];
      auVar13[0xc] = auVar61[6];
      auVar13._0_12_ = auVar61._0_12_;
      auVar13._13_2_ = auVar11._13_2_;
      auVar14[0xb] = 0;
      auVar14._0_11_ = auVar61._0_11_;
      auVar14._12_3_ = auVar13._12_3_;
      auVar15[10] = auVar61[5];
      auVar15._0_10_ = auVar61._0_10_;
      auVar15._11_4_ = auVar14._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar61._0_9_;
      auVar16._10_5_ = auVar15._10_5_;
      auVar18[8] = auVar61[4];
      auVar18._0_8_ = auVar61._0_8_;
      auVar18._9_6_ = auVar16._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar18._8_7_;
      Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar61[3]);
      auVar24._9_6_ = 0;
      auVar24._0_9_ = Var20;
      auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar21[0] = auVar61[2];
      auVar25._11_4_ = 0;
      auVar25._0_11_ = auVar21;
      auVar22._1_12_ = SUB1512(auVar25 << 0x20,3);
      auVar22[0] = auVar61[1];
      uVar60 = CONCAT11(0,auVar61[0]);
      auVar61._2_13_ = auVar22;
      auVar61._0_2_ = uVar60;
      auVar12._10_2_ = 0;
      auVar12._0_10_ = auVar61._0_10_;
      auVar12._12_2_ = (short)Var20;
      auVar23._2_4_ = auVar12._10_4_;
      auVar23._0_2_ = auVar21._0_2_;
      auVar23._6_8_ = 0;
      auVar17._6_8_ = SUB148(auVar23 << 0x40,6);
      auVar17._4_2_ = auVar22._0_2_;
      auVar17._2_2_ = 0;
      auVar17._0_2_ = uVar60;
      pIVar35[sVar55].eos = (int)auVar17._0_8_;
      pIVar35[sVar55].embeddingDirection = (int)((ulong)auVar17._0_8_ >> 0x20);
      sVar55 = sVar55 + 1;
    }
  }
  for (sVar46 = 0; sVar46 != sVar55; sVar46 = sVar46 + 1) {
    psVar53 = ctx->irsindices;
    pIVar35 = ctx->irslist;
    sVar43 = pIVar35[sVar46].start;
    psVar33 = psVar53 + sVar43;
    ctx->irs = psVar33;
    sVar36 = pIVar35[sVar46].end;
    uVar56 = sVar36 - sVar43;
    ctx->irslen = uVar56;
    uVar57._0_4_ = pIVar35[sVar46].sos;
    uVar57._4_4_ = pIVar35[sVar46].eos;
    ctx->sos = (undefined4)uVar57;
    ctx->eos = uVar57._4_4_;
    ctx->embeddingDirection = pIVar35[sVar46].embeddingDirection;
    for (sVar48 = sVar43; BVar30 = (BidiType)uVar57, sVar36 != sVar48; sVar48 = sVar48 + 1) {
      BVar50 = ctx->types[psVar53[sVar48]];
      if (BVar50 == NSM) {
        ctx->types[psVar53[sVar48]] = BVar30;
LAB_00101c75:
        uVar57 = (ulong)BVar30;
      }
      else {
        uVar57 = 0x16;
        if ((0xd08U >> (BVar50 & (CS|AN)) & 1) == 0) {
          if (BVar50 != BN) {
            BVar30 = BVar50;
          }
          goto LAB_00101c75;
        }
      }
    }
    BVar30 = ctx->sos;
    for (sVar48 = sVar43; sVar49 = sVar43, sVar36 != sVar48; sVar48 = sVar48 + 1) {
      BVar50 = ctx->types[psVar53[sVar48]];
      if ((BVar50 == EN) && (BVar30 == AL)) {
        ctx->types[psVar53[sVar48]] = AN;
        BVar30 = AL;
      }
      else if ((0x31U >> (BVar50 & (CS|AN)) & 1) != 0) {
        BVar30 = BVar50;
      }
    }
    for (; sVar36 != sVar49; sVar49 = sVar49 + 1) {
      if (ctx->types[psVar53[sVar49]] == AL) {
        ctx->types[psVar53[sVar49]] = R;
      }
    }
    BVar30 = ON;
    sVar49 = 0;
    BVar50 = BVar30;
    for (sVar48 = sVar43; sVar36 != sVar48; sVar48 = sVar48 + 1) {
      sVar6 = psVar53[sVar48];
      BVar4 = ctx->types[sVar6];
      sVar51 = sVar49;
      BVar54 = BVar50;
      BVar26 = BVar30;
      if ((BVar4 != BN) && (sVar51 = sVar6, BVar54 = BVar4, BVar26 = BVar50, BVar30 == BVar4)) {
        BVar54 = BVar30;
        if (BVar30 == EN && BVar50 == ES) {
LAB_00101d2e:
          ctx->types[sVar49] = BVar30;
        }
        else if (BVar50 == CS) {
          if ((BVar30 == AN) || (BVar30 == EN)) goto LAB_00101d2e;
          BVar26 = CS;
        }
      }
      BVar30 = BVar26;
      sVar49 = sVar51;
      BVar50 = BVar54;
    }
    bVar59 = false;
    for (sVar48 = sVar43; uVar57 = uVar56, sVar36 != sVar48; sVar48 = sVar48 + 1) {
      BVar30 = ctx->types[psVar53[sVar48]];
      bVar27 = true;
      if (BVar30 != EN) {
        if ((bVar59) && ((0x44000U >> (BVar30 & (CS|AN)) & 1) != 0)) {
          ctx->types[psVar53[sVar48]] = EN;
          bVar27 = bVar59;
        }
        else {
          bVar27 = false;
        }
      }
      bVar59 = bVar27;
    }
    while (bVar27 = bVar59, uVar57 = uVar57 - 1, uVar57 != 0xffffffffffffffff) {
      BVar30 = ctx->types[psVar33[uVar57]];
      bVar59 = BVar30 == EN;
      if ((!bVar59) && (bVar27)) {
        if ((0x44000U >> (BVar30 & (CS|AN)) & 1) == 0) {
          bVar59 = false;
        }
        else {
          ctx->types[psVar33[uVar57]] = EN;
          bVar59 = bVar27;
        }
      }
    }
    bVar59 = false;
    for (sVar48 = sVar43; uVar57 = uVar56, sVar36 != sVar48; sVar48 = sVar48 + 1) {
      BVar30 = ctx->types[psVar53[sVar48]];
      bVar27 = true;
      if ((0x16000U >> (BVar30 & (CS|AN)) & 1) == 0) {
        if (BVar30 != BN || (bool)~bVar59) {
          bVar27 = false;
        }
        else {
          ctx->types[psVar53[sVar48]] = CS;
          bVar27 = bVar59;
        }
      }
      bVar59 = bVar27;
    }
    while (uVar57 = uVar57 - 1, sVar48 = sVar43, uVar57 != 0xffffffffffffffff) {
      BVar30 = ctx->types[psVar33[uVar57]];
      if ((0x16000U >> (BVar30 & (CS|AN)) & 1) == 0) {
        if ((BVar30 == BN) && (bVar59)) {
          ctx->types[psVar33[uVar57]] = CS;
        }
        else {
          bVar59 = false;
        }
      }
      else {
        bVar59 = true;
      }
    }
    for (; sVar36 != sVar48; sVar48 = sVar48 + 1) {
      if ((0x16000U >> (ctx->types[psVar53[sVar48]] & (CS|AN)) & 1) != 0) {
        ctx->types[psVar53[sVar48]] = ON;
      }
    }
    BVar30 = ctx->sos;
    for (; sVar36 != sVar43; sVar43 = sVar43 + 1) {
      BVar50 = ctx->types[psVar53[sVar43]];
      if ((BVar50 == EN) && (BVar30 == L)) {
        ctx->types[psVar53[sVar43]] = L;
        BVar30 = L;
      }
      else if ((0x31U >> (BVar50 & (CS|AN)) & 1) != 0) {
        BVar30 = BVar50;
      }
    }
    for (uVar57 = 0; uVar57 < uVar56; uVar57 = uVar57 + 1) {
      ctx->bracketpos[uVar57] = 0xffffffffffffffff;
      uVar56 = ctx->irslen;
    }
    uVar37 = 0;
    uVar57 = 0;
LAB_00101f0a:
    if (uVar37 < uVar56) {
      uVar47 = ctx->text[psVar33[uVar37]].wc;
      uVar52 = 0x80;
      uVar44 = 0xffffffff;
      do {
        while( true ) {
          if ((int)uVar52 + -1 <= (int)uVar44) goto LAB_00101fd6;
          uVar9 = (long)((int)uVar44 + (int)uVar52) / 2;
          lVar39 = (long)(int)uVar9 * 0x10;
          if (uVar47 < *(uint *)(bracket_type_bracket_pairs + lVar39)) break;
          uVar44 = uVar9 & 0xffffffff;
          if (uVar47 <= *(uint *)(bracket_type_bracket_pairs + lVar39)) {
            if (*(int *)(bracket_type_bracket_pairs + lVar39 + 0xc) == 1) {
              if (0x3e < uVar57) goto LAB_00101fe1;
              ctx->bstack[uVar57].ch = uVar47;
              ctx->bstack[uVar57].c = uVar37;
              uVar57 = uVar57 + 1;
              goto LAB_00101fd6;
            }
            if (*(int *)(bracket_type_bracket_pairs + lVar39 + 0xc) != 2) goto LAB_00101fd6;
            psVar53 = &ctx->bstack[uVar57].c;
            uVar52 = uVar57;
            goto LAB_00101f8a;
          }
        }
        uVar52 = uVar9 & 0xffffffff;
      } while( true );
    }
LAB_00101fe1:
    uVar57 = 0;
LAB_00101fea:
    if (uVar57 < uVar56) {
      uVar37 = ctx->bracketpos[uVar57];
      if (uVar37 != 0xffffffffffffffff) {
        pBVar31 = ctx->types;
        psVar33 = ctx->irs;
        if (((0x780000U >> (pBVar31[psVar33[uVar57]] & (CS|AN)) & 1) == 0) ||
           ((0x780000U >> (pBVar31[psVar33[uVar37]] & (CS|AN)) & 1) == 0)) goto LAB_001020e3;
        bVar59 = false;
        uVar52 = uVar57;
        do {
          do {
            uVar44 = uVar52 + 1;
            if (uVar37 <= uVar44) {
              uVar52 = uVar57;
              if (!bVar59) goto LAB_001020e3;
              goto LAB_00102083;
            }
            BVar50 = pBVar31[psVar33[uVar52 + 1]];
            uVar52 = uVar44;
          } while ((0x9031U >> (BVar50 & (CS|AN)) & 1) == 0);
          BVar30 = (uint)(BVar50 != L) << 2;
          bVar59 = true;
        } while ((uint)(BVar50 != L) << 2 != ctx->embeddingDirection);
        goto LAB_001020bc;
      }
      goto LAB_001020e3;
    }
    BVar30 = ctx->sos;
    uVar57 = 0xffffffffffffffff;
    for (uVar37 = 0; uVar37 != uVar56 + 1; uVar37 = uVar37 + 1) {
      pBVar31 = &ctx->eos;
      if (uVar37 < uVar56) {
        pBVar31 = ctx->types + ctx->irs[uVar37];
      }
      BVar50 = *pBVar31;
      if ((0x9031U >> (BVar50 & (CS|AN)) & 1) == 0) {
        uVar52 = uVar57;
        if (uVar57 == 0xffffffffffffffff) {
          uVar52 = uVar37;
        }
        if ((1 << ((byte)BVar50 & 0x1f) & 0x700d08U) != 0) {
          uVar57 = uVar52;
        }
      }
      else {
        BVar50 = (uint)(BVar50 != L) << 2;
        if (uVar57 != 0xffffffffffffffff) {
          if (BVar50 != BVar30) {
            BVar30 = ctx->embeddingDirection;
          }
          for (; uVar57 < uVar37; uVar57 = uVar57 + 1) {
            if ((0x700d08U >> (ctx->types[ctx->irs[uVar57]] & (CS|AN)) & 1) != 0) {
              ctx->types[ctx->irs[uVar57]] = BVar30;
            }
          }
        }
        uVar57 = 0xffffffffffffffff;
        BVar30 = BVar50;
      }
    }
    for (uVar57 = 0; uVar57 < uVar56; uVar57 = uVar57 + 1) {
      sVar43 = ctx->irs[uVar57];
      bVar28 = ctx->levels[sVar43];
      BVar30 = ctx->types[sVar43];
      if ((bVar28 & 1) == 0) {
        if ((BVar30 == AN) || (BVar30 == EN)) {
          bVar28 = bVar28 + 2;
        }
        else {
          if (BVar30 != R) goto LAB_0010220d;
          bVar28 = bVar28 | 1;
        }
LAB_00102202:
        ctx->levels[sVar43] = bVar28;
        uVar56 = ctx->irslen;
      }
      else if ((BVar30 < CS) && ((0x9001U >> (BVar30 & (CS|AN)) & 1) != 0)) {
        bVar28 = bVar28 + 1;
        goto LAB_00102202;
      }
LAB_0010220d:
    }
  }
  ctx->irslen = 0;
  bVar59 = true;
  sVar55 = ctx->textlen;
LAB_00102238:
  do {
    sVar46 = sVar55 - 1;
    if (sVar55 == 0) {
      for (uVar57 = 0; uVar56 = ctx->textlen, uVar57 < uVar56; uVar57 = uVar57 + 1) {
        if ((0x402c6U >> (ctx->origTypes[uVar57] & (CS|AN)) & 1) != 0) {
          puVar32 = ctx->levels + (uVar57 - 1);
          if (uVar57 == 0) {
            puVar32 = &ctx->paragraphLevel;
          }
          (ctx->levels + (uVar57 - 1))[1] = *puVar32;
        }
      }
      for (uVar57 = 0; uVar57 != uVar56; uVar57 = uVar57 + 1) {
        if ((ctx->levels[uVar57] & 1) != 0) {
          puVar58 = &ctx->text[uVar57].wc;
          uVar47 = *puVar58;
          uVar52 = 0x1ac;
          uVar37 = 0xffffffffffffffff;
          do {
            iVar10 = (int)uVar37;
            uVar44 = uVar52;
            do {
              uVar52 = uVar44;
              if ((int)uVar52 <= iVar10 + 1) goto LAB_00102322;
              uVar37 = (long)((int)uVar52 + iVar10) / 2;
              uVar42 = *(uint *)(mirror_glyph_mirror_pairs + (long)(int)uVar37 * 8);
              uVar44 = uVar37 & 0xffffffff;
            } while (uVar42 >= uVar47 && uVar42 != uVar47);
          } while (uVar42 < uVar47);
          uVar47 = *(uint *)(mirror_glyph_mirror_pairs + (long)(int)uVar37 * 8 + 4);
LAB_00102322:
          *puVar58 = uVar47;
        }
      }
      uVar47 = 0;
      for (uVar57 = 0; uVar56 != uVar57; uVar57 = uVar57 + 1) {
        if (uVar47 <= ctx->levels[uVar57]) {
          uVar47 = (uint)ctx->levels[uVar57];
        }
      }
      do {
        uVar42 = uVar47;
        if (uVar42 == 0) {
          return;
        }
        for (uVar57 = 0; uVar47 = uVar42 - 1, uVar57 < uVar56; uVar57 = uVar57 + 1) {
          if (uVar42 <= ctx->levels[uVar57]) {
            uVar37 = uVar57;
            do {
              uVar44 = uVar37 + 1;
              uVar52 = uVar56 - 1;
              if (uVar56 <= uVar44) break;
              uVar52 = uVar37;
              uVar37 = uVar44;
            } while (uVar42 <= ctx->levels[uVar44]);
            lVar39 = uVar57 * 0xc;
            if (uVar56 < uVar44) {
              uVar44 = uVar56;
            }
            uVar56 = uVar52;
            lVar40 = uVar44 * 0xc;
            for (; uVar57 < uVar56; uVar57 = uVar57 + 1) {
              pbVar7 = ctx->text;
              uVar5 = *(undefined4 *)((long)&pbVar7->index + lVar39);
              uVar8 = *(undefined8 *)((long)&pbVar7->origwc + lVar39);
              *(undefined8 *)((long)&pbVar7->origwc + lVar39) =
                   *(undefined8 *)((long)&pbVar7[-1].origwc + lVar40);
              *(undefined4 *)((long)&pbVar7->index + lVar39) =
                   *(undefined4 *)((long)&pbVar7[-1].index + lVar40);
              pbVar7 = ctx->text;
              *(undefined4 *)((long)&pbVar7[-1].index + lVar40) = uVar5;
              *(undefined8 *)((long)&pbVar7[-1].origwc + lVar40) = uVar8;
              uVar56 = uVar56 - 1;
              lVar39 = lVar39 + 0xc;
              lVar40 = lVar40 + -0xc;
            }
            uVar56 = ctx->textlen;
            uVar57 = uVar52;
          }
        }
      } while( true );
    }
    uVar47 = 1 << ((byte)ctx->origTypes[sVar46] & 0x1f);
    if ((0x180000U >> (ctx->origTypes[sVar46] & (CS|AN)) & 1) == 0) {
      if (bVar59) {
        if ((uVar47 & 0x200d08) != 0) goto LAB_00102254;
        bVar59 = (uVar47 & 0x402c6) != 0;
        sVar55 = sVar46;
      }
      else {
        bVar59 = false;
        sVar55 = sVar46;
      }
      goto LAB_00102238;
    }
LAB_00102254:
    ctx->levels[sVar55 - 1] = ctx->paragraphLevel;
    bVar59 = true;
    sVar55 = sVar46;
  } while( true );
  while( true ) {
    plVar1 = (long *)(psVar53 + -3);
    psVar53 = psVar53 + -2;
    if (((int)*plVar1 == (int)*(undefined8 *)(bracket_type_bracket_pairs + lVar39 + 4)) ||
       ((int)*plVar1 ==
        (int)((ulong)*(undefined8 *)(bracket_type_bracket_pairs + lVar39 + 4) >> 0x20))) break;
LAB_00101f8a:
    bVar59 = uVar52 == 0;
    uVar52 = uVar52 - 1;
    if (bVar59) goto LAB_00101fd6;
  }
  ctx->bracketpos[*psVar53] = uVar37;
  uVar56 = ctx->irslen;
  uVar57 = uVar52;
LAB_00101fd6:
  uVar37 = uVar37 + 1;
  goto LAB_00101f0a;
  while (uVar52 = uVar44, (0x9031U >> (pBVar31[psVar33[uVar44]] & (CS|AN)) & 1) == 0) {
LAB_00102083:
    uVar44 = uVar52 - 1;
    if (uVar52 == 0) {
      BVar30 = ctx->sos;
      if (BVar30 == ON) goto LAB_001020e3;
      goto LAB_001020bc;
    }
  }
  BVar30 = (uint)(pBVar31[psVar33[uVar44]] != L) << 2;
LAB_001020bc:
  reset_bracket_type(ctx,uVar57,BVar30);
  reset_bracket_type(ctx,uVar37,BVar30);
  uVar56 = ctx->irslen;
LAB_001020e3:
  uVar57 = uVar57 + 1;
  goto LAB_00101fea;
}

Assistant:

void do_bidi_new(BidiContext *ctx, bidi_char *text, size_t textlen)
{
    ensure_arrays(ctx, textlen);
    ctx->text = text;
    ctx->textlen = textlen;
    setup_types(ctx);

    /* Quick initial test: see if we need to bother with any work at all */
    if (!text_needs_bidi(ctx))
        return;

    set_paragraph_level(ctx);
    process_explicit_embeddings(ctx);
    remove_embedding_characters(ctx);
    find_isolating_run_sequences(ctx, process_isolating_run_sequence);

    /* If this implementation distinguished paragraphs from lines,
     * then this would be the point where we repeat the remainder of
     * the algorithm once for each line in the paragraph. */

    reset_whitespace_and_separators(ctx);
    mirror_glyphs(ctx);
    reverse_sequences(ctx);
}